

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::MethodOptions::ByteSizeLong(MethodOptions *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *pRVar9;
  long lVar10;
  
  sVar5 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  pRVar9 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
    }
  }
  lVar10 = sVar5 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar9 != (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = UninterpretedOption::ByteSizeLong
                      ((UninterpretedOption *)
                       (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar10 = lVar10 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  sVar5 = (ulong)((uVar3 & 2) >> 1) * 3 + lVar10;
  if ((uVar3 & 5) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar7 = FeatureSet::ByteSizeLong((this->field_0)._impl_.features_);
      uVar4 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 4) != 0) {
      uVar8 = (long)(this->field_0)._impl_.idempotency_level_ | 1;
      lVar10 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar10 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t MethodOptions::ByteSizeLong() const {
  const MethodOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000002u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x00000005u) != 0) {
    // optional .google.protobuf.FeatureSet features = 35;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_idempotency_level());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}